

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::queryCacheSizes_amd(int *l1,int *l2,int *l3)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  int abcd [4];
  int *l3_local;
  int *l2_local;
  int *l1_local;
  
  puVar1 = (uint *)cpuid(0x80000000);
  if (*puVar1 < 0x80000006) {
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
  }
  else {
    lVar2 = cpuid(0x80000005);
    *l1 = (*(int *)(lVar2 + 0xc) >> 0x18) << 10;
    lVar2 = cpuid(0x80000006);
    uVar3 = *(uint *)(lVar2 + 8);
    *l2 = (*(int *)(lVar2 + 0xc) >> 0x10) << 10;
    *l3 = ((int)(uVar3 & 0xfffc000) >> 0x12) << 0x13;
  }
  return;
}

Assistant:

inline void queryCacheSizes_amd(int& l1, int& l2, int& l3)
{
  int abcd[4];
  abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
  
  // First query the max supported function.
  EIGEN_CPUID(abcd,0x80000000,0);
  if(static_cast<numext::uint32_t>(abcd[0]) >= static_cast<numext::uint32_t>(0x80000006))
  {
    EIGEN_CPUID(abcd,0x80000005,0);
    l1 = (abcd[2] >> 24) * 1024; // C[31:24] = L1 size in KB
    abcd[0] = abcd[1] = abcd[2] = abcd[3] = 0;
    EIGEN_CPUID(abcd,0x80000006,0);
    l2 = (abcd[2] >> 16) * 1024; // C[31;16] = l2 cache size in KB
    l3 = ((abcd[3] & 0xFFFC000) >> 18) * 512 * 1024; // D[31;18] = l3 cache size in 512KB
  }
  else
  {
    l1 = l2 = l3 = 0;
  }
}